

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsIteratorImmutableExplicitCbeginCend(void)

{
  int *piVar1;
  pointer piVar2;
  ostream *poVar3;
  pointer piVar4;
  int iVar5;
  int iVar6;
  initializer_list<int> __l;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> values;
  int local_18 [4];
  
  local_18[0] = 1;
  local_18[1] = 2;
  local_18[2] = 3;
  local_18[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,&local_31);
  piVar4 = (pointer)0x0;
  piVar2 = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      == values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    piVar2 = piVar4;
  }
  iVar5 = 0;
  do {
    if ((pointer)((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) == piVar4) {
      iVar6 = 0;
      if (iVar5 == 4) goto LAB_0017587d;
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x144);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(counter) == (4)");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_0017587a;
    }
    piVar1 = (int *)((long)piVar2 + (long)piVar4);
    iVar6 = iVar5 + 1;
    piVar4 = piVar4 + 1;
    iVar5 = *piVar1;
  } while (*piVar1 == iVar6);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x142);
  poVar3 = std::operator<<(poVar3,": error: ");
  poVar3 = std::operator<<(poVar3,"(*itr) == (++counter)");
  poVar3 = std::operator<<(poVar3," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_0017587a:
  iVar6 = 1;
LAB_0017587d:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return iVar6;
}

Assistant:

int testSpanTestsIteratorImmutableExplicitCbeginCend()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    int counter = 0;
    for (auto itr = span.cbegin(); itr != span.cend(); ++itr) {
        static_assert(std::is_same<decltype(*itr), const int&>::value, "iterator must be const");
        ML_ASSERT_EQ(*itr, ++counter);
    }
    ML_ASSERT_EQ(counter, 4);

    return 0;
}